

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

bool __thiscall
cmCacheManager::ReadPropertyEntry(cmCacheManager *this,string *entryKey,CacheEntry *e)

{
  int iVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  CacheEntry *this_00;
  char *pcVar6;
  mapped_type *this_01;
  allocator<char> local_e1;
  string local_e0;
  mapped_type *local_c0;
  CacheEntry *ne;
  string local_b0;
  CacheEntry *local_80;
  CacheEntry *entry;
  string key;
  size_type plen;
  char *p;
  char **__end1;
  char **__begin1;
  char *(*__range1) [3];
  char *end;
  CacheEntry *e_local;
  string *entryKey_local;
  cmCacheManager *this_local;
  
  if (e->Type == INTERNAL) {
    lVar2 = std::__cxx11::string::c_str();
    lVar3 = std::__cxx11::string::size();
    for (__end1 = PersistentProperties; __end1 != (char **)&DAT_01115588; __end1 = __end1 + 1) {
      pcVar6 = *__end1;
      sVar4 = strlen(pcVar6);
      key.field_2._8_8_ = sVar4 + 1;
      uVar5 = std::__cxx11::string::size();
      if ((((ulong)key.field_2._8_8_ < uVar5) &&
          (*(char *)((lVar2 + lVar3) - key.field_2._8_8_) == '-')) &&
         (iVar1 = strcmp((char *)(((lVar2 + lVar3) - key.field_2._8_8_) + 1),pcVar6), iVar1 == 0)) {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)&entry,(ulong)entryKey);
        this_00 = GetCacheEntry(this,(string *)&entry);
        local_80 = this_00;
        if (this_00 == (CacheEntry *)0x0) {
          this_01 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                    ::operator[](&this->Cache,(key_type *)&entry);
          local_c0 = this_01;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,pcVar6,&local_e1);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          CacheEntry::SetProperty(this_01,&local_e0,pcVar6);
          std::__cxx11::string::~string((string *)&local_e0);
          std::allocator<char>::~allocator(&local_e1);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,pcVar6,(allocator<char> *)((long)&ne + 7));
          pcVar6 = (char *)std::__cxx11::string::c_str();
          CacheEntry::SetProperty(this_00,&local_b0,pcVar6);
          std::__cxx11::string::~string((string *)&local_b0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&ne + 7));
        }
        std::__cxx11::string::~string((string *)&entry);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool cmCacheManager::ReadPropertyEntry(const std::string& entryKey,
                                       const CacheEntry& e)
{
  // All property entries are internal.
  if (e.Type != cmStateEnums::INTERNAL) {
    return false;
  }

  const char* end = entryKey.c_str() + entryKey.size();
  for (const char* p : cmCacheManager::PersistentProperties) {
    std::string::size_type plen = strlen(p) + 1;
    if (entryKey.size() > plen && *(end - plen) == '-' &&
        strcmp(end - plen + 1, p) == 0) {
      std::string key = entryKey.substr(0, entryKey.size() - plen);
      if (auto* entry = this->GetCacheEntry(key)) {
        // Store this property on its entry.
        entry->SetProperty(p, e.Value.c_str());
      } else {
        // Create an entry and store the property.
        CacheEntry& ne = this->Cache[key];
        ne.SetProperty(p, e.Value.c_str());
      }
      return true;
    }
  }
  return false;
}